

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseDragging(ImGuiMouseButton button,float lock_threshold)

{
  bool local_21;
  ImGuiContext *g;
  float lock_threshold_local;
  ImGuiMouseButton button_local;
  
  local_21 = 4 < (uint)button;
  if (local_21) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*g.IO.MouseDown)))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1131,"bool ImGui::IsMouseDragging(ImGuiMouseButton, float)");
  }
  if (((GImGui->IO).MouseDown[button] & 1U) == 0) {
    lock_threshold_local._3_1_ = false;
  }
  else {
    lock_threshold_local._3_1_ = IsMouseDragPastThreshold(button,lock_threshold);
  }
  return lock_threshold_local._3_1_;
}

Assistant:

bool ImGui::IsMouseDragging(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (!g.IO.MouseDown[button])
        return false;
    return IsMouseDragPastThreshold(button, lock_threshold);
}